

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

int gtStripContig(TIFFRGBAImage *img,uint32_t *raster,uint32_t w,uint32_t h)

{
  undefined1 auVar1 [16];
  tileContigRoutine p_Var2;
  uint uVar3;
  uint32_t uVar4;
  char *pcVar5;
  tmsize_t bufsizetoalloc;
  tmsize_t tVar6;
  tmsize_t tVar7;
  uint uVar8;
  uint32_t local_104;
  uint local_e4;
  uint32_t *puStack_c0;
  uint32_t temp_1;
  uint32_t *right;
  uint32_t *left;
  uint32_t line;
  tmsize_t roffset;
  uint32_t temp;
  tmsize_t maxstripsize;
  int flip;
  int ret;
  int32_t toskew;
  int32_t fromskew;
  tmsize_t scanline;
  ushort local_70;
  undefined1 local_6e [2];
  uint32_t imagewidth;
  uint16_t subsamplingver;
  uint16_t subsamplinghor;
  uint32_t rowsperstrip;
  uchar *buf;
  tmsize_t pos;
  uint local_50;
  uint32_t rowstoread;
  uint32_t nrowsub;
  uint32_t nrow;
  uint32_t y;
  uint32_t row;
  tileContigRoutine put;
  TIFF *tif;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t *raster_local;
  TIFFRGBAImage *img_local;
  
  put = (tileContigRoutine)img->tif;
  _y = img->put;
  _subsamplingver = (void *)0x0;
  maxstripsize._4_4_ = 1;
  tif._0_4_ = h;
  tif._4_4_ = w;
  _h_local = raster;
  raster_local = (uint32_t *)img;
  TIFFGetFieldDefaulted((TIFF *)put,0x212,local_6e,&local_70);
  p_Var2 = put;
  if (local_70 == 0) {
    pcVar5 = TIFFFileName((TIFF *)put);
    TIFFErrorExtR((TIFF *)p_Var2,pcVar5,"Invalid vertical YCbCr subsampling");
    img_local._4_4_ = 0;
  }
  else {
    bufsizetoalloc = TIFFStripSize((TIFF *)put);
    uVar3 = setorientation((TIFFRGBAImage *)raster_local);
    p_Var2 = put;
    if ((uVar3 & 1) == 0) {
      nrowsub = 0;
    }
    else {
      if (0x7fffffff < tif._4_4_) {
        pcVar5 = TIFFFileName((TIFF *)put);
        TIFFErrorExtR((TIFF *)p_Var2,pcVar5,"Width overflow");
        return 0;
      }
      nrowsub = (uint32_t)tif - 1;
    }
    TIFFGetFieldDefaulted((TIFF *)put,0x116,&imagewidth);
    tVar6 = TIFFScanlineSize((TIFF *)put);
    for (nrow = 0; p_Var2 = put, nrow < (uint32_t)tif; nrow = rowstoread + nrow) {
      pos._4_4_ = imagewidth - (nrow + raster_local[0x22]) % imagewidth;
      local_e4 = pos._4_4_;
      if ((uint32_t)tif < nrow + pos._4_4_) {
        local_e4 = (uint32_t)tif - nrow;
      }
      rowstoread = local_e4;
      local_50 = local_e4;
      if (local_e4 % (uint)local_70 != 0) {
        local_50 = ((uint)local_70 - local_e4 % (uint)local_70) + local_e4;
      }
      uVar8 = (nrow + raster_local[0x22]) % imagewidth + local_50;
      if ((0 < tVar6) &&
         (auVar1._8_8_ = 0, auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8),
         SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(tVar6),0) < (ulong)uVar8))
      {
        pcVar5 = TIFFFileName((TIFF *)put);
        TIFFErrorExtR((TIFF *)p_Var2,pcVar5,"Integer overflow in gtStripContig");
        return 0;
      }
      uVar4 = TIFFComputeStrip((TIFF *)put,nrow + raster_local[0x22],0);
      tVar7 = _TIFFReadEncodedStripAndAllocBuffer
                        ((TIFF *)p_Var2,uVar4,(void **)&subsamplingver,bufsizetoalloc,
                         (ulong)uVar8 * tVar6);
      if ((tVar7 == -1) && ((_subsamplingver == (void *)0x0 || (raster_local[2] != 0)))) {
        maxstripsize._4_4_ = 0;
        break;
      }
      buf = (uchar *)(((ulong)(nrow + raster_local[0x22]) % (ulong)imagewidth) * tVar6 +
                     (long)(int)raster_local[0x23] * (ulong)*(ushort *)((long)raster_local + 0x1e));
      (*_y)((TIFFRGBAImage *)raster_local);
      if ((uVar3 & 1) == 0) {
        local_104 = rowstoread;
      }
      else {
        local_104 = -rowstoread;
      }
      nrowsub = local_104 + nrowsub;
    }
    if ((uVar3 & 2) != 0) {
      for (left._4_4_ = 0; left._4_4_ < (uint32_t)tif; left._4_4_ = left._4_4_ + 1) {
        right = _h_local + left._4_4_ * tif._4_4_;
        puStack_c0 = right + tif._4_4_;
        for (; puStack_c0 = puStack_c0 + -1, right < puStack_c0; right = right + 1) {
          uVar4 = *right;
          *right = *puStack_c0;
          *puStack_c0 = uVar4;
        }
      }
    }
    _TIFFfreeExt(*(TIFF **)raster_local,_subsamplingver);
    img_local._4_4_ = maxstripsize._4_4_;
  }
  return img_local._4_4_;
}

Assistant:

static int gtStripContig(TIFFRGBAImage *img, uint32_t *raster, uint32_t w,
                         uint32_t h)
{
    TIFF *tif = img->tif;
    tileContigRoutine put = img->put.contig;
    uint32_t row, y, nrow, nrowsub, rowstoread;
    tmsize_t pos;
    unsigned char *buf = NULL;
    uint32_t rowsperstrip;
    uint16_t subsamplinghor, subsamplingver;
    uint32_t imagewidth = img->width;
    tmsize_t scanline;
    int32_t fromskew, toskew;
    int ret = 1, flip;
    tmsize_t maxstripsize;

    TIFFGetFieldDefaulted(tif, TIFFTAG_YCBCRSUBSAMPLING, &subsamplinghor,
                          &subsamplingver);
    if (subsamplingver == 0)
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Invalid vertical YCbCr subsampling");
        return (0);
    }

    maxstripsize = TIFFStripSize(tif);

    flip = setorientation(img);
    if (flip & FLIP_VERTICALLY)
    {
        if (w > INT_MAX)
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "Width overflow");
            return (0);
        }
        y = h - 1;
        toskew = -(int32_t)(w + w);
    }
    else
    {
        y = 0;
        toskew = -(int32_t)(w - w);
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_ROWSPERSTRIP, &rowsperstrip);

    scanline = TIFFScanlineSize(tif);
    fromskew = (w < imagewidth ? imagewidth - w : 0);
    for (row = 0; row < h; row += nrow)
    {
        uint32_t temp;
        rowstoread = rowsperstrip - (row + img->row_offset) % rowsperstrip;
        nrow = (row + rowstoread > h ? h - row : rowstoread);
        nrowsub = nrow;
        if ((nrowsub % subsamplingver) != 0)
            nrowsub += subsamplingver - nrowsub % subsamplingver;
        temp = (row + img->row_offset) % rowsperstrip + nrowsub;
        if (scanline > 0 && temp > (size_t)(TIFF_TMSIZE_T_MAX / scanline))
        {
            TIFFErrorExtR(tif, TIFFFileName(tif),
                          "Integer overflow in gtStripContig");
            return 0;
        }
        if (_TIFFReadEncodedStripAndAllocBuffer(
                tif, TIFFComputeStrip(tif, row + img->row_offset, 0),
                (void **)(&buf), maxstripsize,
                temp * scanline) == (tmsize_t)(-1) &&
            (buf == NULL || img->stoponerr))
        {
            ret = 0;
            break;
        }

        pos = ((row + img->row_offset) % rowsperstrip) * scanline +
              ((tmsize_t)img->col_offset * img->samplesperpixel);
        tmsize_t roffset = (tmsize_t)y * w;
        (*put)(img, raster + roffset, 0, y, w, nrow, fromskew, toskew,
               buf + pos);
        y += ((flip & FLIP_VERTICALLY) ? -(int32_t)nrow : (int32_t)nrow);
    }

    if (flip & FLIP_HORIZONTALLY)
    {
        uint32_t line;

        for (line = 0; line < h; line++)
        {
            uint32_t *left = raster + (line * w);
            uint32_t *right = left + w - 1;

            while (left < right)
            {
                uint32_t temp = *left;
                *left = *right;
                *right = temp;
                left++;
                right--;
            }
        }
    }

    _TIFFfreeExt(img->tif, buf);
    return (ret);
}